

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O1

WaitResult<bool> __thiscall FindUserDataCallable::operator()(FindUserDataCallable *this)

{
  pointer __s2;
  _List_node_base *p_Var1;
  _List_node_base *__n;
  int iVar2;
  int3 iVar3;
  _List_node_base *p_Var4;
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> peers;
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> local_40;
  
  udpdiscovery::Peer::ListDiscovered_abi_cxx11_
            ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *)
             &local_40,this->peer_);
  if (local_40._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_40) {
    __s2 = (this->user_data_)._M_dataplus._M_p;
    p_Var1 = (_List_node_base *)(this->user_data_)._M_string_length;
    p_Var4 = local_40._M_impl._M_node.super__List_node_base._M_next;
    do {
      __n = p_Var4[2]._M_next;
      if (__n == p_Var1) {
        iVar3 = 1;
        if (__n == (_List_node_base *)0x0) goto LAB_0010782f;
        iVar2 = bcmp(p_Var4[1]._M_prev,__s2,(size_t)__n);
        if (iVar2 == 0) goto LAB_0010782f;
      }
      p_Var4 = (((_List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)&local_40);
  }
  iVar3 = 0;
LAB_0010782f:
  std::__cxx11::
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_clear
            (&local_40);
  return (WaitResult<bool>)(iVar3 << 8 | 0x10000);
}

Assistant:

WaitResult<bool> operator()() {
    std::list<udpdiscovery::DiscoveredPeer> peers = peer_.ListDiscovered();
    for (std::list<udpdiscovery::DiscoveredPeer>::iterator it = peers.begin();
         it != peers.end(); ++it) {
      if ((*it).user_data() == user_data_) {
        WaitResult<bool> result;
        result.has_result = true;
        result.result = true;

        return result;
      }
    }

    return WaitResult<bool>();
  }